

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall Liby::Buffer::retrieve(Buffer *this,off_t len)

{
  off_t oVar1;
  off_t len_local;
  Buffer *this_local;
  
  if (len < 0) {
    __assert_fail("len >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                  ,0xe8,"void Liby::Buffer::retrieve(off_t)");
  }
  oVar1 = size(this);
  if (oVar1 != 0) {
    oVar1 = size(this);
    if (oVar1 < len) {
      this->rightIndex_ = 0;
      this->leftIndex_ = 0;
    }
    else {
      this->leftIndex_ = len + this->leftIndex_;
    }
  }
  return;
}

Assistant:

void Buffer::retrieve(off_t len) {
    assert(len >= 0);
    if (size() == 0) {
        return;
    } else if (len > size()) {
        leftIndex_ = rightIndex_ = 0;
    } else {
        leftIndex_ += len;
    }
    //    if (size() < capacity_ / 2) {
    //        Buffer b(*this);
    //        swap(b);
    //    }
}